

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

QRect __thiscall QToolBarAreaLayoutInfo::itemRect(QToolBarAreaLayoutInfo *this,QList<int> *path)

{
  int iVar1;
  int *piVar2;
  QToolBarAreaLayoutLine *pQVar3;
  QToolBarAreaLayoutItem *pQVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  QRect QVar10;
  
  piVar2 = (path->d).ptr;
  iVar1 = *piVar2;
  iVar9 = piVar2[1];
  pQVar3 = (this->lines).d.ptr;
  pQVar4 = pQVar3[iVar1].toolBarItems.d.ptr;
  uVar5._0_4_ = pQVar3[iVar1].rect.x1;
  uVar5._4_4_ = pQVar3[iVar1].rect.y1;
  uVar7._0_4_ = pQVar3[iVar1].rect.x2;
  uVar7._4_4_ = pQVar3[iVar1].rect.y2;
  uVar6 = uVar5 >> 0x20;
  iVar1 = pQVar4[iVar9].pos;
  iVar9 = pQVar4[iVar9].size + -1;
  if (this->o == Horizontal) {
    uVar8 = iVar1 + (undefined4)uVar5;
    uVar7 = uVar7 & 0xffffffff00000000 | (ulong)(iVar9 + uVar8);
    uVar5 = (ulong)uVar8;
  }
  else {
    uVar8 = iVar1 + uVar5._4_4_;
    uVar7 = uVar7 & 0xffffffff | (ulong)(iVar9 + uVar8) << 0x20;
    uVar6 = (ulong)uVar8;
  }
  QVar10._0_8_ = uVar5 & 0xffffffff | uVar6 << 0x20;
  QVar10.x2.m_i = (int)uVar7;
  QVar10.y2.m_i = (int)(uVar7 >> 0x20);
  return QVar10;
}

Assistant:

const T *data() const noexcept { return ptr; }